

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessToken
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  char *pcVar3;
  Status SVar4;
  int iVar5;
  char *pcVar6;
  Value *pVVar7;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ByteArray *aBytes;
  _Alloc_hider _Var9;
  undefined1 *puVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar11;
  undefined1 *puVar12;
  bool bVar13;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  ByteArray signedToken;
  uint16_t port;
  CommissionerAppPtr commissioner;
  writer write;
  Network curNwk;
  string local_368;
  format_string_checker<char> local_348;
  undefined1 local_310 [8];
  _Alloc_hider local_308;
  undefined1 local_300 [8];
  char local_2f8 [16];
  _Alloc_hider local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  string *local_2c8;
  string *local_2c0;
  CommissionerAppPtr local_2b8;
  writer local_2a8 [3];
  ErrorCode local_290;
  undefined1 *local_288;
  long local_280;
  undefined1 local_278 [16];
  ErrorCode local_268;
  undefined1 *local_260;
  long local_258;
  undefined1 local_250 [16];
  ErrorCode local_240;
  undefined1 *local_238;
  long local_230;
  undefined1 local_228 [16];
  ErrorCode local_218;
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  ErrorCode local_1f0;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  ErrorCode local_1c8;
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  ErrorCode local_1a0;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188 [16];
  ErrorCode local_178 [2];
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  Error local_150;
  ErrorCode local_128 [2];
  undefined1 *local_120;
  long local_118;
  undefined1 local_110 [16];
  Error local_100;
  Error local_d8;
  string local_b0;
  Network local_90;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_2b8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_2b8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  persistent_storage::Network::Network(&local_90);
  JobManager::GetSelectedCommissioner
            (&local_d8,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_2b8);
  local_310._0_4_ = local_d8.mCode;
  local_308._M_p = local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_308,local_d8.mMessage._M_dataplus._M_p,
             local_d8.mMessage._M_dataplus._M_p + local_d8.mMessage._M_string_length);
  local_2c8 = (string *)&(__return_storage_ptr__->mError).mMessage;
  local_2e0 = 0;
  local_2d8._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mError).mCode = local_310._0_4_;
  local_2e8._M_p = (pointer)&local_2d8;
  std::__cxx11::string::operator=(local_2c8,(string *)&local_308);
  local_2c0 = (string *)&__return_storage_ptr__->mData;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)&local_2e8);
  EVar1 = (__return_storage_ptr__->mError).mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_p != &local_2d8) {
    operator_delete(local_2e8._M_p);
  }
  if (local_308._M_p != local_2f8) {
    operator_delete(local_308._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.mMessage._M_dataplus._M_p != &local_d8.mMessage.field_2) {
    operator_delete(local_d8.mMessage._M_dataplus._M_p);
  }
  if (EVar1 != kNone) goto LAB_0011c287;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    local_348._0_8_ = local_348._0_8_ & 0xffffffff00000000;
    local_348.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "too few arguments";
    local_348.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
    local_348.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_348.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_348.parse_funcs_[0] = (parse_func)0x0;
    pcVar11 = "too few arguments";
    local_348.context_.types_ = local_348.types_;
    do {
      pcVar6 = pcVar11 + 1;
      if (*pcVar11 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar11 + 2;
      }
      else if (*pcVar11 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar11,"",&local_348);
      }
      pcVar11 = pcVar6;
    } while (pcVar6 != "");
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_348;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_368,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_00);
    local_1a0 = kInvalidArgs;
    puVar12 = local_188;
    local_198 = puVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_368._M_dataplus._M_p,
               local_368._M_string_length + local_368._M_dataplus._M_p);
    local_310._0_4_ = local_1a0;
    local_308._M_p = local_2f8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_308,local_198,local_198 + local_190);
    local_2e0 = 0;
    local_2d8._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_310._0_4_;
    local_2e8._M_p = (pointer)&local_2d8;
    std::__cxx11::string::operator=(local_2c8,(string *)&local_308);
    std::__cxx11::string::operator=(local_2c0,(string *)&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_p != &local_2d8) {
      operator_delete(local_2e8._M_p);
    }
    puVar10 = local_198;
    if (local_308._M_p != local_2f8) {
      operator_delete(local_308._M_p);
      puVar10 = local_198;
    }
LAB_0011c26a:
    if (puVar10 != puVar12) {
      operator_delete(puVar10);
    }
    paVar8 = &local_368.field_2;
    _Var9._M_p = local_368._M_dataplus._M_p;
LAB_0011c27d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p == paVar8) goto LAB_0011c287;
  }
  else {
    SVar4 = persistent_storage::Registry::GetCurrentNetwork
                      ((this->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&local_90);
    if (SVar4 != kSuccess) {
      local_348.types_[0] = int_type;
      pcVar11 = "getting current network failed with status={}";
      local_348.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "getting current network failed with status={}";
      local_348.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2d;
      local_348.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_348.context_.super_basic_format_parse_context<char>._20_4_ = 1;
      local_348.parse_funcs_[0] =
           ::fmt::v10::detail::parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_348.context_.types_ = local_348.types_;
      local_2a8[0].handler_ = &local_348;
      do {
        if (pcVar11 == "") break;
        pcVar6 = pcVar11;
        if (*pcVar11 == '{') {
LAB_0011bfca:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int>_>::
          writer::operator()(local_2a8,pcVar11,pcVar6);
          pcVar11 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                              (pcVar6,"",&local_348);
          bVar13 = true;
        }
        else {
          pcVar6 = pcVar11 + 1;
          bVar13 = pcVar6 != "";
          if (bVar13) {
            if (*pcVar6 != '{') {
              pcVar3 = pcVar11 + 2;
              do {
                pcVar6 = pcVar3;
                bVar13 = pcVar6 != "";
                if (pcVar6 == "") goto LAB_0011bfc6;
                pcVar3 = pcVar6 + 1;
              } while (*pcVar6 != '{');
            }
            bVar13 = true;
          }
LAB_0011bfc6:
          if (bVar13) goto LAB_0011bfca;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_int>_>::
          writer::operator()(local_2a8,pcVar11,"");
          bVar13 = false;
        }
      } while (bVar13);
      local_348._0_8_ = ZEXT18(SVar4);
      fmt.size_ = 1;
      fmt.data_ = (char *)0x2d;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_348;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_368,(v10 *)"getting current network failed with status={}",fmt,args);
      local_1c8 = kRegistryError;
      puVar12 = local_1b0;
      local_1c0 = puVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,local_368._M_dataplus._M_p,
                 local_368._M_string_length + local_368._M_dataplus._M_p);
      local_310._0_4_ = local_1c8;
      local_308._M_p = local_2f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_308,local_1c0,local_1c0 + local_1b8);
      local_2e0 = 0;
      local_2d8._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_310._0_4_;
      local_2e8._M_p = (pointer)&local_2d8;
      std::__cxx11::string::operator=(local_2c8,(string *)&local_308);
      std::__cxx11::string::operator=(local_2c0,(string *)&local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_p != &local_2d8) {
        operator_delete(local_2e8._M_p);
      }
      puVar10 = local_1c0;
      if (local_308._M_p != local_2f8) {
        operator_delete(local_308._M_p);
        puVar10 = local_1c0;
      }
      goto LAB_0011c26a;
    }
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    paVar8 = &local_368.field_2;
    local_368._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"request","");
    utils::ToLower((string *)local_310,pbVar2 + 1);
    utils::ToLower((string *)&local_348,&local_368);
    if (local_308._M_p ==
        local_348.context_.super_basic_format_parse_context<char>.format_str_.data_) {
      if (local_308._M_p == (char *)0x0) {
        bVar13 = true;
      }
      else {
        iVar5 = bcmp((void *)CONCAT44(local_310._4_4_,local_310._0_4_),(void *)local_348._0_8_,
                     (size_t)local_308._M_p);
        bVar13 = iVar5 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    if ((size_t *)local_348._0_8_ !=
        &local_348.context_.super_basic_format_parse_context<char>.format_str_.size_) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_) != local_300) {
      operator_delete((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar8) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    if (bVar13) {
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(aExpr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x61) {
        local_348._0_8_ = local_348._0_8_ & 0xffffffff00000000;
        local_348.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "too few arguments";
        local_348.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
        local_348.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_348.context_.super_basic_format_parse_context<char>._20_4_ = 0;
        local_348.parse_funcs_[0] = (parse_func)0x0;
        pcVar11 = "too few arguments";
        local_348.context_.types_ = local_348.types_;
        do {
          pcVar6 = pcVar11 + 1;
          if (*pcVar11 == '}') {
            if ((pcVar6 == "") || (*pcVar6 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar6 = pcVar11 + 2;
          }
          else if (*pcVar11 == '{') {
            pcVar6 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar11,"",&local_348);
          }
          pcVar11 = pcVar6;
        } while (pcVar6 != "");
        args_02.field_1.values_ = in_R9.values_;
        args_02.desc_ = (unsigned_long_long)&local_348;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_368,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_02);
        local_1f0 = kInvalidArgs;
        local_1e8 = local_1d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,local_368._M_dataplus._M_p,
                   local_368._M_string_length + local_368._M_dataplus._M_p);
        local_310._0_4_ = local_1f0;
        local_308._M_p = local_2f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,local_1e8,local_1e8 + local_1e0);
        local_2e0 = 0;
        local_2d8._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_310._0_4_;
        local_2e8._M_p = (pointer)&local_2d8;
        std::__cxx11::string::operator=(local_2c8,(string *)&local_308);
        std::__cxx11::string::operator=(local_2c0,(string *)&local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_p != &local_2d8) {
          operator_delete(local_2e8._M_p);
        }
        if (local_308._M_p != local_2f8) {
          operator_delete(local_308._M_p);
        }
        if (local_1e8 != local_1d8) {
          operator_delete(local_1e8);
        }
        _Var9._M_p = local_368._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p == paVar8) goto LAB_0011c287;
        goto LAB_0011c282;
      }
      if ((local_90.mId.mId == 0xffffffff) || (local_90.mCcm != 0)) {
        utils::ParseInteger<unsigned_short>(&local_100,(unsigned_short *)&local_348,pbVar2 + 3);
        local_310._0_4_ = local_100.mCode;
        local_308._M_p = local_2f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,local_100.mMessage._M_dataplus._M_p,
                   local_100.mMessage._M_dataplus._M_p + local_100.mMessage._M_string_length);
        local_2e8._M_p = (pointer)&local_2d8;
        local_2e0 = 0;
        local_2d8._M_local_buf[0] = '\0';
        pVVar7 = Value::operator=(__return_storage_ptr__,(Value *)local_310);
        EVar1 = (pVVar7->mError).mCode;
        Value::~Value((Value *)local_310);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.mMessage._M_dataplus._M_p != &local_100.mMessage.field_2) {
          operator_delete(local_100.mMessage._M_dataplus._M_p);
        }
        if (EVar1 == kNone) {
          (*((local_2b8.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x42])
                    (local_128,
                     local_2b8.
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(aExpr->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 2,local_348._0_8_ & 0xffff
                    );
          local_310._0_4_ = local_128[0];
          local_308._M_p = local_2f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_308,local_120,local_120 + local_118);
          local_2e8._M_p = (pointer)&local_2d8;
          local_2e0 = 0;
          local_2d8._M_local_buf[0] = '\0';
          pVVar7 = Value::operator=(__return_storage_ptr__,(Value *)local_310);
          EVar1 = (pVVar7->mError).mCode;
          Value::~Value((Value *)local_310);
          if (local_120 != local_110) {
            operator_delete(local_120);
          }
          if ((EVar1 == kNone) && (local_90.mId.mId == 0xffffffff)) {
            JobManager::UpdateDefaultConfigCommissionerToken
                      ((this->mJobManager).
                       super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
        }
        goto LAB_0011c287;
      }
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_368;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&local_348,(v10 *)"request disallowed when non-CCM network selected",
                 (string_view)ZEXT816(0x30),args_01);
      local_218 = kInvalidState;
      puVar12 = local_200;
      local_210 = puVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,local_348._0_8_,
                 local_348.context_.super_basic_format_parse_context<char>.format_str_.data_ +
                 local_348._0_8_);
      local_310._0_4_ = local_218;
      local_308._M_p = local_2f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_308,local_210,local_210 + local_208);
      local_2e8._M_p = (pointer)&local_2d8;
      local_2e0 = 0;
      local_2d8._M_local_buf[0] = '\0';
      Value::operator=(__return_storage_ptr__,(Value *)local_310);
      Value::~Value((Value *)local_310);
      puVar10 = local_210;
LAB_0011cc6a:
      if (puVar10 != puVar12) {
        operator_delete(puVar10);
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&local_348.context_.super_basic_format_parse_context<char>.format_str_.size_;
      _Var9._M_p = (pointer)local_348._0_8_;
      goto LAB_0011c27d;
    }
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_368._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"print","");
    utils::ToLower((string *)local_310,pbVar2 + 1);
    utils::ToLower((string *)&local_348,&local_368);
    if (local_308._M_p ==
        local_348.context_.super_basic_format_parse_context<char>.format_str_.data_) {
      if (local_308._M_p == (char *)0x0) {
        bVar13 = true;
      }
      else {
        iVar5 = bcmp((void *)CONCAT44(local_310._4_4_,local_310._0_4_),(void *)local_348._0_8_,
                     (size_t)local_308._M_p);
        bVar13 = iVar5 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    if ((size_t *)local_348._0_8_ !=
        &local_348.context_.super_basic_format_parse_context<char>.format_str_.size_) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_) != local_300) {
      operator_delete((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar8) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    if (bVar13) {
      iVar5 = (*((local_2b8.
                  super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x41])();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_368,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(extraout_var,iVar5));
      if (local_368._M_dataplus._M_p == (pointer)local_368._M_string_length) {
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        args_03.field_1.args_ = in_R9.args_;
        args_03.desc_ = (unsigned_long_long)local_2a8;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&local_348,(v10 *)"no valid Commissioner Token found",
                   (string_view)ZEXT816(0x21),args_03);
        local_240 = kNotFound;
        puVar12 = local_228;
        local_238 = puVar12;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,local_348._0_8_,
                   local_348.context_.super_basic_format_parse_context<char>.format_str_.data_ +
                   local_348._0_8_);
        local_310._0_4_ = local_240;
        local_308._M_p = local_2f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,local_238,local_238 + local_230);
        local_2e8._M_p = (pointer)&local_2d8;
        local_2e0 = 0;
        local_2d8._M_local_buf[0] = '\0';
        Value::operator=(__return_storage_ptr__,(Value *)local_310);
        Value::~Value((Value *)local_310);
        puVar10 = local_238;
LAB_0011cd40:
        if (puVar10 != puVar12) {
          operator_delete(puVar10);
        }
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&local_348.context_.super_basic_format_parse_context<char>.format_str_.size_;
        local_b0._M_dataplus._M_p = (pointer)local_348._0_8_;
      }
      else {
        utils::Hex_abi_cxx11_(&local_b0,(utils *)&local_368,aBytes);
        Value::Value((Value *)local_310,&local_b0);
        Value::operator=(__return_storage_ptr__,(Value *)local_310);
        Value::~Value((Value *)local_310);
        paVar8 = &local_b0.field_2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar8) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
    else {
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_368._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"set","");
      utils::ToLower((string *)local_310,pbVar2 + 1);
      utils::ToLower((string *)&local_348,&local_368);
      if (local_308._M_p ==
          local_348.context_.super_basic_format_parse_context<char>.format_str_.data_) {
        if (local_308._M_p == (char *)0x0) {
          bVar13 = true;
        }
        else {
          iVar5 = bcmp((void *)CONCAT44(local_310._4_4_,local_310._0_4_),(void *)local_348._0_8_,
                       (size_t)local_308._M_p);
          bVar13 = iVar5 == 0;
        }
      }
      else {
        bVar13 = false;
      }
      if ((size_t *)local_348._0_8_ !=
          &local_348.context_.super_basic_format_parse_context<char>.format_str_.size_) {
        operator_delete((void *)local_348._0_8_);
      }
      if ((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_) != local_300) {
        operator_delete((undefined1 *)CONCAT44(local_310._4_4_,local_310._0_4_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != paVar8) {
        operator_delete(local_368._M_dataplus._M_p);
      }
      if (!bVar13) {
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_368._M_dataplus._M_p = pbVar2[1]._M_dataplus._M_p;
        local_368._M_string_length = pbVar2[1]._M_string_length;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x1f;
        args_04.field_1.values_ = in_R9.values_;
        args_04.desc_ = (unsigned_long_long)&local_368;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&local_348,(v10 *)"\'{}\' is not a valid sub-command",fmt_00,args_04);
        local_290 = kInvalidCommand;
        puVar12 = local_278;
        local_288 = puVar12;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_288,local_348._0_8_,
                   local_348.context_.super_basic_format_parse_context<char>.format_str_.data_ +
                   local_348._0_8_);
        local_310._0_4_ = local_290;
        local_308._M_p = local_2f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,local_288,local_288 + local_280);
        local_2e8._M_p = (pointer)&local_2d8;
        local_2e0 = 0;
        local_2d8._M_local_buf[0] = '\0';
        Value::operator=(__return_storage_ptr__,(Value *)local_310);
        Value::~Value((Value *)local_310);
        puVar10 = local_288;
        goto LAB_0011cc6a;
      }
      local_368._M_dataplus._M_p = (pointer)0x0;
      local_368._M_string_length = 0;
      local_368.field_2._M_allocated_capacity = 0;
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(aExpr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        args_05.field_1.values_ = in_R9.values_;
        args_05.desc_ = (unsigned_long_long)local_2a8;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&local_348,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                   args_05);
        local_268 = kInvalidArgs;
        puVar12 = local_250;
        local_260 = puVar12;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_260,local_348._0_8_,
                   local_348.context_.super_basic_format_parse_context<char>.format_str_.data_ +
                   local_348._0_8_);
        local_310._0_4_ = local_268;
        local_308._M_p = local_2f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,local_260,local_260 + local_258);
        local_2e8._M_p = (pointer)&local_2d8;
        local_2e0 = 0;
        local_2d8._M_local_buf[0] = '\0';
        Value::operator=(__return_storage_ptr__,(Value *)local_310);
        Value::~Value((Value *)local_310);
        puVar10 = local_260;
        goto LAB_0011cd40;
      }
      ReadHexStringFile(&local_150,(ByteArray *)&local_368,pbVar2 + 2);
      local_310._0_4_ = local_150.mCode;
      local_308._M_p = local_2f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_308,local_150.mMessage._M_dataplus._M_p,
                 local_150.mMessage._M_dataplus._M_p + local_150.mMessage._M_string_length);
      local_2e8._M_p = (pointer)&local_2d8;
      local_2e0 = 0;
      local_2d8._M_local_buf[0] = '\0';
      pVVar7 = Value::operator=(__return_storage_ptr__,(Value *)local_310);
      EVar1 = (pVVar7->mError).mCode;
      Value::~Value((Value *)local_310);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.mMessage._M_dataplus._M_p != &local_150.mMessage.field_2) {
        operator_delete(local_150.mMessage._M_dataplus._M_p);
      }
      if (EVar1 == kNone) {
        (*((local_2b8.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_CommissionerHandler)._vptr_CommissionerHandler[0x43])
                  (local_178,
                   local_2b8.
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,&local_368);
        local_310._0_4_ = local_178[0];
        local_308._M_p = local_2f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,local_170,local_170 + local_168);
        local_2e8._M_p = (pointer)&local_2d8;
        local_2e0 = 0;
        local_2d8._M_local_buf[0] = '\0';
        pVVar7 = Value::operator=(__return_storage_ptr__,(Value *)local_310);
        EVar1 = (pVVar7->mError).mCode;
        Value::~Value((Value *)local_310);
        if (local_170 != local_160) {
          operator_delete(local_170);
        }
        if ((EVar1 == kNone) && (local_90.mId.mId == 0xffffffff)) {
          JobManager::UpdateDefaultConfigCommissionerToken
                    ((this->mJobManager).
                     super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
      }
    }
    _Var9._M_p = local_368._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0011c287;
  }
LAB_0011c282:
  operator_delete(_Var9._M_p);
LAB_0011c287:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mMlp._M_dataplus._M_p != &local_90.mMlp.field_2) {
    operator_delete(local_90.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.mName._M_dataplus._M_p != &local_90.mName.field_2) {
    operator_delete(local_90.mName._M_dataplus._M_p);
  }
  if (local_2b8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessToken(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;
    RegistryStatus     status;
    Network            curNwk;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    VerifyOrExit((status = mRegistry->GetCurrentNetwork(curNwk)) == RegistryStatus::kSuccess,
                 value = ERROR_REGISTRY_ERROR(RUNTIME_CUR_NETWORK_FAILED " with status={}", static_cast<int>(status)));

    if (CaseInsensitiveEqual(aExpr[1], "request"))
    {
        VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        // request allowed in case of CCM network or no network selected
        if (curNwk.mId.mId == persistent_storage::EMPTY_ID || curNwk.mCcm != 0)
        {
            uint16_t port;
            SuccessOrExit(value = ParseInteger(port, aExpr[3]));
            SuccessOrExit(value = commissioner->RequestToken(aExpr[2], port));
            if (curNwk.mId.mId == persistent_storage::EMPTY_ID)
            {
                // when there is no network selected, a successful
                // 'token request' must update default configuration
                mJobManager->UpdateDefaultConfigCommissionerToken();
            }
        }
        else
        {
            ExitNow(value = ERROR_INVALID_STATE("request disallowed when non-CCM network selected"));
        }
    }
    else if (CaseInsensitiveEqual(aExpr[1], "print"))
    {
        auto signedToken = commissioner->GetToken();
        VerifyOrExit(!signedToken.empty(), value = ERROR_NOT_FOUND("no valid Commissioner Token found"));
        value = utils::Hex(signedToken);
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        ByteArray signedToken;
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ReadHexStringFile(signedToken, aExpr[2]));

        SuccessOrExit(value = commissioner->SetToken(signedToken));
        if (curNwk.mId.mId == persistent_storage::EMPTY_ID)
        {
            // when there is no network selected, a successful
            // 'token set' must update default configuration
            // as well
            mJobManager->UpdateDefaultConfigCommissionerToken();
        }
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}